

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

sqlite3_stmt * __thiscall SQLite::Statement::getPreparedStatement(Statement *this)

{
  element_type *peVar1;
  Exception *this_00;
  sqlite3_stmt *ret;
  Statement *this_local;
  
  peVar1 = std::__shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->mpPreparedStatement).
                       super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>);
  if (peVar1 != (element_type *)0x0) {
    return peVar1;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,"Statement was not prepared.");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

sqlite3_stmt* Statement::getPreparedStatement() const
{
    sqlite3_stmt* ret = mpPreparedStatement.get();
    if (ret)
    {
        return ret;
    }
    throw SQLite::Exception("Statement was not prepared.");
}